

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harris.cpp
# Opt level: O2

Derivatives * __thiscall
Harris::ApplyGaussToDerivatives
          (Derivatives *__return_storage_ptr__,Harris *this,Derivatives *dMats,int filterRange)

{
  int range;
  Mat *img;
  Mat *img_00;
  Harris HStack_78;
  
  img = &HStack_78.harrisResponses;
  img_00 = &HStack_78.harrisResponses;
  if (filterRange == 0) {
    Derivatives::Derivatives(__return_storage_ptr__,dMats);
  }
  else {
    Derivatives::Derivatives(__return_storage_ptr__);
    range = (int)dMats;
    GaussFilter(&HStack_78,&this->harrisResponses,range);
    cv::Mat::operator=(&__return_storage_ptr__->Ix,&HStack_78.harrisResponses);
    cv::Mat::~Mat(&HStack_78.harrisResponses);
    GaussFilter(&HStack_78,img,range + 0x60);
    cv::Mat::operator=(&__return_storage_ptr__->Iy,&HStack_78.harrisResponses);
    cv::Mat::~Mat(&HStack_78.harrisResponses);
    GaussFilter(&HStack_78,img_00,range + 0xc0);
    cv::Mat::operator=(&__return_storage_ptr__->Ixy,&HStack_78.harrisResponses);
    cv::Mat::~Mat(&HStack_78.harrisResponses);
  }
  return __return_storage_ptr__;
}

Assistant:

Derivatives Harris::ApplyGaussToDerivatives(Derivatives& dMats, int filterRange) {
    if(filterRange == 0)
        return dMats;

    Derivatives mdMats;

    mdMats.Ix = GaussFilter(dMats.Ix, filterRange);
    mdMats.Iy = GaussFilter(dMats.Iy, filterRange);
    mdMats.Ixy = GaussFilter(dMats.Ixy, filterRange);

    return mdMats;
}